

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool add_item_to_array(cJSON *array,cJSON *item)

{
  cJSON *local_28;
  cJSON *child;
  cJSON *item_local;
  cJSON *array_local;
  
  if ((item == (cJSON *)0x0) || (array == (cJSON *)0x0)) {
    array_local._4_4_ = 0;
  }
  else {
    local_28 = array->child;
    if (local_28 == (cJSON *)0x0) {
      array->child = item;
    }
    else {
      for (; local_28->next != (cJSON *)0x0; local_28 = local_28->next) {
      }
      suffix_object(local_28,item);
    }
    array_local._4_4_ = 1;
  }
  return array_local._4_4_;
}

Assistant:

static cJSON_bool add_item_to_array(cJSON *array, cJSON *item)
{
    cJSON *child = NULL;

    if ((item == NULL) || (array == NULL))
    {
        return false;
    }

    child = array->child;

    if (child == NULL)
    {
        /* list is empty, start new one */
        array->child = item;
    }
    else
    {
        /* append to the end */
        while (child->next)
        {
            child = child->next;
        }
        suffix_object(child, item);
    }

    return true;
}